

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O2

void __thiscall
JsUtil::BackgroundJobProcessor::AddJob(BackgroundJobProcessor *this,Job *job,bool prioritize)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  if (job == (Job *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x3ed,"(job)","job");
    if (!bVar2) goto LAB_005f93b4;
    *puVar4 = 0;
  }
  bVar2 = DoublyLinkedList<JsUtil::JobManager,_Memory::ArenaAllocator>::Contains
                    (&(this->super_JobProcessor).managers,job->manager);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x3ee,"(managers.Contains(job->Manager()))",
                       "managers.Contains(job->Manager())");
    if (!bVar2) goto LAB_005f93b4;
    *puVar4 = 0;
  }
  if ((this->super_JobProcessor).isClosed == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x3ef,"(!IsClosed())","!IsClosed()");
    if (!bVar2) {
LAB_005f93b4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar3 = this->numJobs + 1;
  if (uVar3 != 0) {
    this->numJobs = uVar3;
    JobProcessor::AddJob(&this->super_JobProcessor,job,prioritize);
    IndicateNewJob(this);
    return;
  }
  Js::Throw::OutOfMemory();
}

Assistant:

void BackgroundJobProcessor::AddJob(Job *const job, const bool prioritize)
    {
        // This function is called from inside the lock

        Assert(job);
        Assert(managers.Contains(job->Manager()));
        Assert(!IsClosed());

        if(numJobs + 1 == 0)
            Js::Throw::OutOfMemory(); // Overflow: job counts we use are int32's.
        ++numJobs;

        __super::AddJob(job, prioritize);
        IndicateNewJob();
    }